

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

void vault_objects(chunk_conflict *c,loc grid,wchar_t depth,wchar_t num)

{
  _Bool _Var1;
  uint32_t uVar2;
  loc_conflict local_2c;
  loc near;
  wchar_t i;
  wchar_t num_local;
  wchar_t depth_local;
  chunk_conflict *c_local;
  loc grid_local;
  
  near.y = num;
  do {
    if (near.y < 1) {
      return;
    }
    for (near.x = 0; near.x < 0xb; near.x = near.x + 1) {
      _Var1 = find_nearby_grid(c,(loc *)&local_2c,grid,L'\x02',L'\x03');
      if (!_Var1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-util.c"
                      ,0x340,"void vault_objects(struct chunk *, struct loc, int, int)");
      }
      _Var1 = square_canputitem((chunk *)c,local_2c);
      if (_Var1) {
        uVar2 = Rand_div(100);
        if ((int)uVar2 < 0x4b) {
          place_object(c,(loc)local_2c,depth,false,false,'\x03',L'\0');
        }
        else {
          place_gold(c,(loc)local_2c,depth,'\x05');
        }
        break;
      }
    }
    near.y = near.y + -1;
  } while( true );
}

Assistant:

void vault_objects(struct chunk *c, struct loc grid, int depth, int num)
{
	int i;

	/* Attempt to place 'num' objects */
	for (; num > 0; --num) {
		/* Try up to 11 spots looking for empty space */
		for (i = 0; i < 11; ++i) {
			struct loc near;

			/* Pick a random location */
			if (!find_nearby_grid(c, &near, grid, 2, 3)) assert(0);

			/* Require "clean" floor space */
			if (!square_canputitem(c, near)) continue;

			/* Place an item or gold */
			if (randint0(100) < 75)
				place_object(c, near, depth, false, false, ORIGIN_SPECIAL, 0);
			else
				place_gold(c, near, depth, ORIGIN_VAULT);

			/* Placement accomplished */
			break;
		}
	}
}